

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_comparison.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::EnumComparisonRule::Apply
          (EnumComparisonRule *this,LogicalOperator *op,
          vector<std::reference_wrapper<duckdb::Expression>,_true> *bindings,bool *changes_made,
          bool is_root)

{
  ExpressionType type;
  bool bVar1;
  reference pvVar2;
  BoundComparisonExpression *pBVar3;
  BoundCastExpression *pBVar4;
  BoundCastExpression *pBVar5;
  pointer pEVar6;
  pointer pEVar7;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var8;
  pointer *__ptr;
  char in_R9B;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_00;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_01;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> cast_left_to_right;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  children;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_c8;
  undefined1 local_c0 [8];
  _Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> local_b8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_b0;
  undefined1 local_a8 [32];
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_88;
  Value local_70;
  
  local_b0._M_head_impl = (Expression *)this;
  pvVar2 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,0);
  pBVar3 = BaseExpression::Cast<duckdb::BoundComparisonExpression>
                     (&pvVar2->_M_data->super_BaseExpression);
  pvVar2 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,1);
  pBVar4 = BaseExpression::Cast<duckdb::BoundCastExpression>(&pvVar2->_M_data->super_BaseExpression)
  ;
  pvVar2 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,3);
  pBVar5 = BaseExpression::Cast<duckdb::BoundCastExpression>(&pvVar2->_M_data->super_BaseExpression)
  ;
  this_00 = &pBVar4->child;
  pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_00);
  this_01 = &pBVar5->child;
  pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_01);
  bVar1 = AreMatchesPossible(&pEVar6->return_type,&pEVar7->return_type);
  if (bVar1) {
    if ((in_R9B == '\0') ||
       (*(char *)&(bindings->
                  super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
                  ).
                  super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish != '\x02')) {
      ((local_b0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression = (_func_int **)0x0;
      _Var8._M_head_impl = local_b0._M_head_impl;
    }
    else {
      local_c8._M_head_impl =
           (this_00->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (this_00->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
      .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this_01);
      BoundCastExpression::AddDefaultCastToType
                ((BoundCastExpression *)local_c0,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_c8,&pEVar6->return_type,true);
      if (local_c8._M_head_impl != (Expression *)0x0) {
        (*((local_c8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_c8._M_head_impl = (Expression *)0x0;
      type = (pBVar3->super_Expression).super_BaseExpression.type;
      pBVar3 = (BoundComparisonExpression *)operator_new(0x68);
      local_a8._0_8_ = local_c0;
      local_c0 = (undefined1  [8])0x0;
      local_b8.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
           (_Head_base<0UL,_duckdb::Expression_*,_false>)
           (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
      .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      BoundComparisonExpression::BoundComparisonExpression
                (pBVar3,type,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_a8,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)&local_b8);
      if (local_b8.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
          (Expression *)0x0) {
        (**(code **)(*(long *)local_b8.super__Head_base<0UL,_duckdb::Expression_*,_false>.
                              _M_head_impl + 8))();
      }
      local_b8.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
           (_Head_base<0UL,_duckdb::Expression_*,_false>)(Expression *)0x0;
      if ((Expression *)local_a8._0_8_ != (Expression *)0x0) {
        (**(code **)(*(_func_int **)local_a8._0_8_ + 8))();
      }
      _Var8._M_head_impl = local_b0._M_head_impl;
      ((local_b0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression = (_func_int **)pBVar3;
      if (local_c0 != (undefined1  [8])0x0) {
        (**(code **)(*(_func_int **)local_c0 + 8))();
      }
    }
  }
  else {
    local_a8._0_8_ = (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
    local_a8._8_8_ = 0;
    local_a8._16_8_ = 0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)local_a8,&pBVar3->left);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)local_a8,&pBVar3->right);
    local_88.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_a8._0_8_;
    local_88.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_a8._8_8_;
    local_88.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_a8._16_8_;
    local_a8._0_8_ = (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
    local_a8._8_8_ = 0;
    local_a8._16_8_ = 0;
    Value::BOOLEAN(&local_70,false);
    _Var8._M_head_impl = local_b0._M_head_impl;
    ExpressionRewriter::ConstantOrNull
              ((ExpressionRewriter *)local_b0._M_head_impl,
               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)&local_88,&local_70);
    Value::~Value(&local_70);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector(&local_88);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)local_a8);
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         _Var8._M_head_impl;
}

Assistant:

unique_ptr<Expression> EnumComparisonRule::Apply(LogicalOperator &op, vector<reference<Expression>> &bindings,
                                                 bool &changes_made, bool is_root) {

	auto &root = bindings[0].get().Cast<BoundComparisonExpression>();
	auto &left_child = bindings[1].get().Cast<BoundCastExpression>();
	auto &right_child = bindings[3].get().Cast<BoundCastExpression>();

	if (!AreMatchesPossible(left_child.child->return_type, right_child.child->return_type)) {
		vector<unique_ptr<Expression>> children;
		children.push_back(std::move(root.left));
		children.push_back(std::move(root.right));
		return ExpressionRewriter::ConstantOrNull(std::move(children), Value::BOOLEAN(false));
	}

	if (!is_root || op.type != LogicalOperatorType::LOGICAL_FILTER) {
		return nullptr;
	}

	auto cast_left_to_right =
	    BoundCastExpression::AddDefaultCastToType(std::move(left_child.child), right_child.child->return_type, true);
	return make_uniq<BoundComparisonExpression>(root.GetExpressionType(), std::move(cast_left_to_right),
	                                            std::move(right_child.child));
}